

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_sigalgs_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  int iVar2;
  CBS supported_signature_algorithms;
  CBS local_20;
  
  OPENSSL_free((hs->peer_sigalgs).data_);
  (hs->peer_sigalgs).data_ = (unsigned_short *)0x0;
  (hs->peer_sigalgs).size_ = 0;
  if (contents == (CBS *)0x0) {
    bVar1 = true;
  }
  else {
    iVar2 = CBS_get_u16_length_prefixed(contents,&local_20);
    if ((iVar2 == 0) || (contents->len != 0)) {
      bVar1 = false;
    }
    else {
      bVar1 = tls1_parse_peer_sigalgs(hs,&local_20);
    }
  }
  return bVar1;
}

Assistant:

static bool ext_sigalgs_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                          CBS *contents) {
  hs->peer_sigalgs.Reset();
  if (contents == NULL) {
    return true;
  }

  CBS supported_signature_algorithms;
  if (!CBS_get_u16_length_prefixed(contents, &supported_signature_algorithms) ||
      CBS_len(contents) != 0 ||
      !tls1_parse_peer_sigalgs(hs, &supported_signature_algorithms)) {
    return false;
  }

  return true;
}